

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

Opnd * __thiscall IR::Opnd::CloneUse(Opnd *this,Func *func)

{
  bool bVar1;
  Func *func_local;
  Opnd *this_local;
  
  switch(this->m_kind) {
  case OpndKindSym:
    bVar1 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
    if (bVar1) {
      this_local = (Opnd *)PropertySymOpnd::CloneUseInternalSub((PropertySymOpnd *)this,func);
    }
    else {
      this_local = &SymOpnd::CloneUseInternal((SymOpnd *)this,func)->super_Opnd;
    }
    break;
  case OpndKindReg:
    bVar1 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar1) {
      this_local = (Opnd *)ArrayRegOpnd::CloneUseInternalSub((ArrayRegOpnd *)this,func);
    }
    else {
      this_local = &RegOpnd::CloneUseInternal((RegOpnd *)this,func)->super_Opnd;
    }
    break;
  default:
    this_local = Copy(this,func);
    break;
  case OpndKindIndir:
    this_local = &IndirOpnd::CloneUseInternal((IndirOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindList:
    this_local = ListOpnd::CloneUseInternal((ListOpnd *)this,func);
  }
  return this_local;
}

Assistant:

Opnd *
Opnd::CloneUse(Func *func)
{
    switch (this->m_kind)
    {
    case OpndKindSym:
        if ((*static_cast<SymOpnd*>(this)).IsPropertySymOpnd())
        {
            return static_cast<PropertySymOpnd*>(this)->CloneUseInternalSub(func);
        }
        return static_cast<SymOpnd*>(this)->CloneUseInternal(func);

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            return static_cast<ArrayRegOpnd*>(this)->CloneUseInternalSub(func);
        }
        return static_cast<RegOpnd*>(this)->CloneUseInternal(func);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->CloneUseInternal(func);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->CloneUseInternal(func);

    default:
        return this->Copy(func);
    };
}